

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O3

WebAssemblyTable * __thiscall
Js::WebAssemblyEnvironment::GetVarElement<Js::WebAssemblyTable>
          (WebAssemblyEnvironment *this,Type *ptr,uint32 index,uint32 maxCount)

{
  Type *pTVar1;
  Var aValue;
  bool bVar2;
  WebAssemblyTable *pWVar3;
  
  if (((index < maxCount) && (pTVar1 = ptr + index, (long)(this->start).ptr <= (long)pTVar1)) &&
     ((long)(pTVar1 + 1) <= (long)(this->end).ptr)) {
    aValue = pTVar1->ptr;
    if (aValue == (Var)0x0) {
      return (WebAssemblyTable *)0x0;
    }
    bVar2 = VarIs<Js::WebAssemblyTable>(aValue);
    if (bVar2) {
      pWVar3 = VarTo<Js::WebAssemblyTable>(aValue);
      return pWVar3;
    }
  }
  Throw::InternalError();
}

Assistant:

T* WebAssemblyEnvironment::GetVarElement(Field(Var)* ptr, uint32 index, uint32 maxCount) const
{
    if (index >= maxCount)
    {
        Js::Throw::InternalError();
    }

    Field(Var)* functionPtr = ptr + index;
    CheckPtrIsValid<T*>((intptr_t)functionPtr);
    Var varFunc = *functionPtr;
    if (varFunc)
    {
        if (!VarIs<T>(varFunc))
        {
            Js::Throw::InternalError();
        }
        return VarTo<T>(varFunc);
    }
    return nullptr;
}